

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

sat_solver * Cec_GiaDeriveSolver(Gia_Man_t *p,Cnf_Dat_t *pCnf,int nTimeOut)

{
  int iVar1;
  sat_solver *s;
  abctime aVar2;
  abctime local_48;
  int local_34;
  int i;
  sat_solver *pSat;
  int nTimeOut_local;
  Cnf_Dat_t *pCnf_local;
  Gia_Man_t *p_local;
  
  s = sat_solver_new();
  sat_solver_setnvars(s,pCnf->nVars);
  local_34 = 0;
  while( true ) {
    if (pCnf->nClauses <= local_34) {
      if (nTimeOut == 0) {
        local_48 = 0;
      }
      else {
        aVar2 = Abc_Clock();
        local_48 = (long)nTimeOut * 1000000 + aVar2;
      }
      sat_solver_set_runtime_limit(s,local_48);
      return s;
    }
    iVar1 = sat_solver_addclause(s,pCnf->pClauses[local_34],pCnf->pClauses[local_34 + 1]);
    if (iVar1 == 0) break;
    local_34 = local_34 + 1;
  }
  sat_solver_delete(s);
  return (sat_solver *)0x0;
}

Assistant:

static inline sat_solver * Cec_GiaDeriveSolver( Gia_Man_t * p, Cnf_Dat_t * pCnf, int nTimeOut )
{
    sat_solver * pSat;
    int i;
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
        {
            // the problem is UNSAT
            sat_solver_delete( pSat );
            return NULL;
        }
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    return pSat;
}